

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O0

int libtorrent::anon_unknown_1::path_length(bdecode_node *p,error_code *ec)

{
  int iVar1;
  type_t tVar2;
  int iVar3;
  undefined1 local_70 [8];
  bdecode_node e;
  int i;
  int len;
  int ret;
  error_code *ec_local;
  bdecode_node *p_local;
  
  i = 0;
  iVar1 = bdecode_node::list_size(p);
  e._60_4_ = 0;
  while( true ) {
    if (iVar1 <= (int)e._60_4_) {
      return i + iVar1;
    }
    bdecode_node::list_at((bdecode_node *)local_70,p,e._60_4_);
    tVar2 = bdecode_node::type((bdecode_node *)local_70);
    if (tVar2 == string_t) {
      iVar3 = bdecode_node::string_length((bdecode_node *)local_70);
      i = iVar3 + i;
    }
    else {
      boost::system::error_code::operator=(ec,torrent_invalid_name);
      p_local._4_4_ = -1;
    }
    bdecode_node::~bdecode_node((bdecode_node *)local_70);
    if (tVar2 != string_t) break;
    e._60_4_ = e._60_4_ + 1;
  }
  return p_local._4_4_;
}

Assistant:

int path_length(bdecode_node const& p, error_code& ec)
	{
		int ret = 0;
		int const len = p.list_size();
		for (int i = 0; i < len; ++i)
		{
			bdecode_node const e = p.list_at(i);
			if (e.type() != bdecode_node::string_t)
			{
				ec = errors::torrent_invalid_name;
				return -1;
			}
			ret += e.string_length();
		}
		return ret + len;
	}